

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

size_t thread_stack_size(void)

{
  undefined1 auVar1 [8];
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 local_20 [8];
  rlimit lim;
  
  iVar2 = getrlimit64(RLIMIT_STACK,(rlimit64 *)local_20);
  auVar1 = local_20;
  if (iVar2 != 0) {
    abort();
  }
  if (local_20 != (undefined1  [8])0xffffffffffffffff) {
    iVar2 = getpagesize();
    uVar3 = (long)local_20 - (ulong)auVar1 % (ulong)(long)iVar2;
    if ((0x1fff < uVar3) &&
       (local_20 = (undefined1  [8])uVar3, uVar4 = __sysconf(0x4b), uVar4 <= uVar3)) {
      return (size_t)local_20;
    }
  }
  return 0x200000;
}

Assistant:

static size_t thread_stack_size(void) {
#if defined(__APPLE__) || defined(__linux__)
  struct rlimit lim;

  if (getrlimit(RLIMIT_STACK, &lim))
    abort();

  if (lim.rlim_cur != RLIM_INFINITY) {
    /* pthread_attr_setstacksize() expects page-aligned values. */
    lim.rlim_cur -= lim.rlim_cur % (rlim_t) getpagesize();

    /* Musl's PTHREAD_STACK_MIN is 2 KB on all architectures, which is
     * too small to safely receive signals on.
     *
     * Musl's PTHREAD_STACK_MIN + MINSIGSTKSZ == 8192 on arm64 (which has
     * the largest MINSIGSTKSZ of the architectures that musl supports) so
     * let's use that as a lower bound.
     *
     * We use a hardcoded value because PTHREAD_STACK_MIN + MINSIGSTKSZ
     * is between 28 and 133 KB when compiling against glibc, depending
     * on the architecture.
     */
    if (lim.rlim_cur >= 8192)
      if (lim.rlim_cur >= PTHREAD_STACK_MIN)
        return lim.rlim_cur;
  }
#endif

#if !defined(__linux__)
  return 0;
#elif defined(__PPC__) || defined(__ppc__) || defined(__powerpc__)
  return 4 << 20;  /* glibc default. */
#else
  return 2 << 20;  /* glibc default. */
#endif
}